

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O3

Glyph * __thiscall
sf::Font::getGlyph(Font *this,Uint32 codePoint,uint characterSize,bool bold,float outlineThickness)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  Page *this_00;
  _Rb_tree_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_> _Var3;
  _Base_ptr p_Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>,_bool> pVar5;
  pair<unsigned_long_long,_sf::Glyph> local_68;
  
  this_00 = loadPage(this,characterSize);
  uVar2 = FT_Get_Char_Index(this->m_face,codePoint);
  local_68.first = (ulong)uVar2 | CONCAT44(outlineThickness,(uint)bold << 0x1f);
  p_Var4 = (this_00->glyphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this_00->glyphs)._M_t._M_impl.super__Rb_tree_header;
    _Var3._M_node = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var4 + 1) >= local_68.first) {
        _Var3._M_node = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < local_68.first];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var3._M_node != p_Var1) &&
       (*(ulong *)(_Var3._M_node + 1) <= local_68.first)) goto LAB_0015aa09;
  }
  loadGlyph(&local_68.second,this,codePoint,characterSize,bold,outlineThickness);
  pVar5 = std::
          _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,sf::Glyph>,std::_Select1st<std::pair<unsigned_long_long_const,sf::Glyph>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,sf::Glyph>>>
          ::_M_emplace_unique<std::pair<unsigned_long_long,sf::Glyph>>
                    ((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,sf::Glyph>,std::_Select1st<std::pair<unsigned_long_long_const,sf::Glyph>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,sf::Glyph>>>
                      *)this_00,&local_68);
  _Var3 = pVar5.first._M_node;
LAB_0015aa09:
  return (Glyph *)&_Var3._M_node[1]._M_parent;
}

Assistant:

const Glyph& Font::getGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // Get the page corresponding to the character size
    GlyphTable& glyphs = loadPage(characterSize).glyphs;

    // Build the key by combining the glyph index (based on code point), bold flag, and outline thickness
    Uint64 key = combine(outlineThickness, bold, FT_Get_Char_Index(static_cast<FT_Face>(m_face), codePoint));

    // Search the glyph into the cache
    GlyphTable::const_iterator it = glyphs.find(key);
    if (it != glyphs.end())
    {
        // Found: just return it
        return it->second;
    }
    else
    {
        // Not found: we have to load it
        Glyph glyph = loadGlyph(codePoint, characterSize, bold, outlineThickness);
        return glyphs.insert(std::make_pair(key, glyph)).first->second;
    }
}